

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_average_block_as_solid(dxt1_endpoint_optimizer *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  unique_color *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  dxt1_solution_coordinates local_4c;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  
  uVar15 = (ulong)(this->m_unique_colors).m_size;
  if (uVar15 == 0) {
    uVar12 = 0;
    lVar10 = 0;
    lVar11 = 0;
    lVar9 = 0;
  }
  else {
    puVar4 = (this->m_unique_colors).m_p;
    uVar13 = 0;
    lVar9 = 0;
    lVar11 = 0;
    lVar10 = 0;
    uVar12 = 0;
    do {
      uVar14 = (ulong)puVar4[uVar13].m_weight;
      uVar12 = uVar12 + puVar4[uVar13].m_weight;
      lVar9 = lVar9 + puVar4[uVar13].m_color.field_0.field_0.r * uVar14;
      lVar11 = lVar11 + puVar4[uVar13].m_color.field_0.field_0.g * uVar14;
      lVar10 = lVar10 + puVar4[uVar13].m_color.field_0.field_0.b * uVar14;
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  uVar13 = CONCAT44(0,uVar12);
  uVar15 = (ulong)(uVar12 >> 1);
  local_38 = (lVar9 + uVar15) / uVar13;
  local_40 = (lVar11 + uVar15) / uVar13;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar13;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = lVar10 + uVar15;
  local_48 = SUB168(auVar6 / auVar5,0);
  uVar13 = local_38 & 0xffffffff;
  uVar14 = local_40 & 0xffffffff;
  uVar15 = (ulong)SUB164(auVar6 / auVar5,0);
  local_4c.m_low_color =
       (ushort)(byte)ryg_dxt::OMatch5[uVar15 * 2] |
       (ushort)(byte)ryg_dxt::OMatch6[uVar14 * 2] << 5 |
       (ushort)(byte)ryg_dxt::OMatch5[uVar13 * 2] << 0xb;
  local_4c.m_high_color =
       (ushort)(byte)ryg_dxt::OMatch5[uVar15 * 2 + 1] |
       (ushort)(byte)ryg_dxt::OMatch6[uVar14 * 2 + 1] << 5 |
       (ushort)(byte)ryg_dxt::OMatch5[uVar13 * 2 + 1] << 0xb;
  bVar7 = evaluate_solution(this,&local_4c,false);
  if ((this->m_pParams->m_use_alpha_blocks == true) && ((this->m_best_solution).m_error != 0)) {
    local_4c.m_low_color =
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar15 * 2] |
         (ushort)(byte)ryg_dxt::OMatch6_3[uVar14 * 2] << 5 |
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar13 * 2] << 0xb;
    local_4c.m_high_color =
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar15 * 2 + 1] |
         (ushort)(byte)ryg_dxt::OMatch6_3[uVar14 * 2 + 1] << 5 |
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar13 * 2 + 1] << 0xb;
    bVar8 = evaluate_solution(this,&local_4c,false);
    bVar7 = bVar7 || bVar8;
  }
  if ((this->m_pParams->m_quality == cCRNDXTQualityUber) && ((this->m_unique_colors).m_size != 0)) {
    uVar15 = 0;
    do {
      puVar4 = (this->m_unique_colors).m_p;
      bVar1 = puVar4[uVar15].m_color.field_0.field_0.r;
      uVar13 = (ulong)bVar1;
      bVar2 = puVar4[uVar15].m_color.field_0.field_0.g;
      uVar14 = (ulong)bVar2;
      bVar3 = puVar4[uVar15].m_color.field_0.field_0.b;
      uVar16 = (ulong)bVar3;
      if (((bVar1 != (uint)local_38) || (bVar2 != (uint)local_40)) || (bVar3 != (uint)local_48)) {
        local_4c.m_low_color =
             (ushort)(byte)ryg_dxt::OMatch5[uVar16 * 2] |
             (ushort)(byte)ryg_dxt::OMatch6[uVar14 * 2] << 5 |
             (ushort)(byte)ryg_dxt::OMatch5[uVar13 * 2] << 0xb;
        local_4c.m_high_color =
             (ushort)(byte)ryg_dxt::OMatch5[uVar16 * 2 + 1] |
             (ushort)(byte)ryg_dxt::OMatch6[uVar14 * 2 + 1] << 5 |
             (ushort)(byte)ryg_dxt::OMatch5[uVar13 * 2 + 1] << 0xb;
        bVar8 = evaluate_solution(this,&local_4c,false);
        bVar7 = (bool)(bVar7 | bVar8);
        if ((this->m_pParams->m_use_alpha_blocks == true) && ((this->m_best_solution).m_error != 0))
        {
          local_4c.m_low_color =
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar16 * 2] |
               (ushort)(byte)ryg_dxt::OMatch6_3[uVar14 * 2] << 5 |
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar13 * 2] << 0xb;
          local_4c.m_high_color =
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar16 * 2 + 1] |
               (ushort)(byte)ryg_dxt::OMatch6_3[uVar14 * 2 + 1] << 5 |
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar13 * 2 + 1] << 0xb;
          bVar8 = evaluate_solution(this,&local_4c,false);
          bVar7 = (bool)(bVar7 | bVar8);
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (this->m_unique_colors).m_size);
  }
  return bVar7;
}

Assistant:

bool dxt1_endpoint_optimizer::try_average_block_as_solid()
    {
        uint64 tot_r = 0;
        uint64 tot_g = 0;
        uint64 tot_b = 0;

        uint total_weight = 0;
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            uint weight = m_unique_colors[i].m_weight;
            total_weight += weight;

            tot_r += m_unique_colors[i].m_color.r * static_cast<uint64>(weight);
            tot_g += m_unique_colors[i].m_color.g * static_cast<uint64>(weight);
            tot_b += m_unique_colors[i].m_color.b * static_cast<uint64>(weight);
        }

        const uint half_total_weight = total_weight >> 1;
        uint ave_r = static_cast<uint>((tot_r + half_total_weight) / total_weight);
        uint ave_g = static_cast<uint>((tot_g + half_total_weight) / total_weight);
        uint ave_b = static_cast<uint>((tot_b + half_total_weight) / total_weight);

        uint low_color = (ryg_dxt::OMatch5[ave_r][0] << 11) | (ryg_dxt::OMatch6[ave_g][0] << 5) | ryg_dxt::OMatch5[ave_b][0];
        uint high_color = (ryg_dxt::OMatch5[ave_r][1] << 11) | (ryg_dxt::OMatch6[ave_g][1] << 5) | ryg_dxt::OMatch5[ave_b][1];
        bool improved = evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

        if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error))
        {
            low_color = (ryg_dxt::OMatch5_3[ave_r][0] << 11) | (ryg_dxt::OMatch6_3[ave_g][0] << 5) | ryg_dxt::OMatch5_3[ave_b][0];
            high_color = (ryg_dxt::OMatch5_3[ave_r][1] << 11) | (ryg_dxt::OMatch6_3[ave_g][1] << 5) | ryg_dxt::OMatch5_3[ave_b][1];
            improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
        }

        if (m_pParams->m_quality == cCRNDXTQualityUber)
        {
            // Try compressing as all-solid using the other (non-average) colors in the block in uber.
            for (uint i = 0; i < m_unique_colors.size(); i++)
            {
                uint r = m_unique_colors[i].m_color[0];
                uint g = m_unique_colors[i].m_color[1];
                uint b = m_unique_colors[i].m_color[2];
                if ((r == ave_r) && (g == ave_g) && (b == ave_b))
                {
                    continue;
                }

                uint low_color = (ryg_dxt::OMatch5[r][0] << 11) | (ryg_dxt::OMatch6[g][0] << 5) | ryg_dxt::OMatch5[b][0];
                uint high_color = (ryg_dxt::OMatch5[r][1] << 11) | (ryg_dxt::OMatch6[g][1] << 5) | ryg_dxt::OMatch5[b][1];
                improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

                if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error))
                {
                    low_color = (ryg_dxt::OMatch5_3[r][0] << 11) | (ryg_dxt::OMatch6_3[g][0] << 5) | ryg_dxt::OMatch5_3[b][0];
                    high_color = (ryg_dxt::OMatch5_3[r][1] << 11) | (ryg_dxt::OMatch6_3[g][1] << 5) | ryg_dxt::OMatch5_3[b][1];
                    improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
                }
            }
        }

        return improved;
    }